

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [32];
  int iVar2;
  int _elempack;
  int *piVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  unsigned_short uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  void *pvVar21;
  _func_int *p_Var22;
  size_t sVar23;
  uint uVar24;
  void *pvVar25;
  long lVar26;
  undefined1 (*pauVar27) [64];
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [16];
  int iVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ushort uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar45;
  
  p_Var22 = this->_vptr_Cast_x86_avx512[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var22) == *(int *)(&this->field_0xd4 + (long)p_Var22)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar18 = bottom_blob->w;
    iVar32 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar18;
    top_blob->h = iVar32;
    top_blob->d = iVar2;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar18 = bottom_blob->w;
  iVar32 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  uVar20 = bottom_blob->c;
  iVar16 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar23 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var22)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var22) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx512 + (long)p_Var22),bottom_blob,
                    top_blob,opt);
    }
    sVar23 = sVar23 * 4;
    break;
  case 2:
  case 4:
    sVar23 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar23 = bottom_blob->elemsize;
  }
  switch(iVar16) {
  case 1:
    Mat::create(top_blob,iVar18,sVar23,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar18,iVar32,sVar23,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar18,iVar32,uVar20,sVar23,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar18,iVar32,iVar2,uVar20,sVar23,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2)) {
    iVar16 = cpu_support_x86_avx512_fp16();
    if (iVar16 == 0) {
      iVar16 = bottom_blob->c;
      if (0 < (long)iVar16) {
        uVar24 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          pauVar30 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar28 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar24 < 8) {
            uVar34 = 0;
          }
          else {
            iVar17 = 7;
            do {
              auVar9 = vcvtps2ph_f16c(*pauVar30,3);
              *pauVar28 = auVar9;
              pauVar30 = pauVar30 + 1;
              pauVar28 = pauVar28 + 1;
              iVar17 = iVar17 + 8;
              uVar34 = uVar24 & 0xfffffff8;
            } while (iVar17 < (int)uVar24);
          }
          uVar19 = uVar34 | 3;
          while ((int)uVar19 < (int)uVar24) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar30,3);
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            uVar19 = uVar34 + 7;
            uVar34 = uVar34 + 4;
          }
          if (uVar24 - uVar34 != 0 && (int)uVar34 <= (int)uVar24) {
            lVar35 = 0;
            do {
              uVar15 = float32_to_float16(*(float *)(*pauVar30 + lVar35 * 4));
              *(unsigned_short *)(*pauVar28 + lVar35 * 2) = uVar15;
              lVar35 = lVar35 + 1;
            } while (uVar24 - uVar34 != (int)lVar35);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar16);
      }
    }
    else {
      cast_fp32_to_fp16_sse_avx512fp16(bottom_blob,top_blob,opt);
    }
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
    iVar16 = cpu_support_x86_avx512_fp16();
    if (iVar16 == 0) {
      iVar16 = bottom_blob->c;
      if (0 < (long)iVar16) {
        uVar24 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          pauVar28 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar30 = (undefined1 (*) [32])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar24 < 8) {
            uVar34 = 0;
          }
          else {
            iVar17 = 7;
            do {
              auVar39 = vcvtph2ps_f16c(*pauVar28);
              *pauVar30 = auVar39;
              pauVar28 = pauVar28 + 1;
              pauVar30 = pauVar30 + 1;
              iVar17 = iVar17 + 8;
              uVar34 = uVar24 & 0xfffffff8;
            } while (iVar17 < (int)uVar24);
          }
          uVar19 = uVar34 | 3;
          while ((int)uVar19 < (int)uVar24) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)*pauVar28;
            auVar9 = vcvtph2ps_f16c(auVar9);
            *(undefined1 (*) [16])*pauVar30 = auVar9;
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
            uVar19 = uVar34 + 7;
            uVar34 = uVar34 + 4;
          }
          if (uVar24 - uVar34 != 0 && (int)uVar34 <= (int)uVar24) {
            lVar35 = 0;
            do {
              fVar45 = float16_to_float32(*(unsigned_short *)(*pauVar28 + lVar35 * 2));
              *(float *)(*pauVar30 + lVar35 * 4) = fVar45;
              lVar35 = lVar35 + 1;
            } while (uVar24 - uVar34 != (int)lVar35);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar16);
      }
    }
    else {
      cast_fp16_to_fp32_sse_avx512fp16(bottom_blob,top_blob,opt);
    }
  }
  pp_Var4 = this->_vptr_Cast_x86_avx512;
  p_Var22 = pp_Var4[-3];
  iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var22);
  if (iVar16 == 3) {
    if ((int)uVar20 < 1 || *(int *)(&this->field_0xd4 + (long)p_Var22) != 1) goto LAB_004da9bc;
    uVar24 = iVar2 * _elempack * iVar32 * iVar18;
    pvVar21 = bottom_blob->data;
    sVar23 = bottom_blob->cstep;
    pvVar25 = top_blob->data;
    sVar5 = top_blob->cstep;
    sVar6 = top_blob->elemsize;
    sVar7 = bottom_blob->elemsize;
    uVar29 = 0;
    do {
      if (0 < (int)uVar24) {
        uVar33 = 0;
        do {
          *(float *)((long)pvVar25 + uVar33 * 4) = (float)(int)*(char *)((long)pvVar21 + uVar33);
          uVar33 = uVar33 + 1;
        } while (uVar24 != uVar33);
      }
      uVar29 = uVar29 + 1;
      pvVar25 = (void *)((long)pvVar25 + sVar5 * sVar6);
      pvVar21 = (void *)((long)pvVar21 + sVar23 * sVar7);
    } while (uVar29 != uVar20);
    p_Var22 = pp_Var4[-3];
    iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var22);
  }
  if ((iVar16 == 1) && (*(int *)(&this->field_0xd4 + (long)p_Var22) == 4)) {
    iVar18 = cpu_support_x86_avx512_bf16();
    if (iVar18 == 0) {
      iVar18 = bottom_blob->c;
      if (0 < (long)iVar18) {
        uVar20 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        auVar39._16_16_ = _DAT_00524a40;
        auVar39._0_16_ = _DAT_00524a40;
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar27 = (undefined1 (*) [64])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar30 = (undefined1 (*) [32])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar20 < 0x10) {
            uVar24 = 0;
          }
          else {
            iVar32 = 0xf;
            do {
              auVar42 = vpsrld_avx512f(*pauVar27,0x10);
              auVar37 = vpmovdw_avx512f(auVar42);
              *pauVar30 = auVar37;
              pauVar27 = pauVar27 + 1;
              pauVar30 = pauVar30 + 1;
              iVar32 = iVar32 + 0x10;
              uVar24 = uVar20 & 0xfffffff0;
            } while (iVar32 < (int)uVar20);
          }
          uVar34 = uVar24 | 7;
          while ((int)uVar34 < (int)uVar20) {
            auVar37 = vpermw_avx512vl(auVar39,*(undefined1 (*) [32])*pauVar27);
            *(undefined1 (*) [16])*pauVar30 = auVar37._0_16_;
            pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x20);
            pauVar30 = (undefined1 (*) [32])((long)*pauVar30 + 0x10);
            uVar34 = uVar24 + 0xf;
            uVar24 = uVar24 + 8;
          }
          if ((int)uVar24 < (int)uVar20) {
            auVar42 = vpbroadcastq_avx512f();
            uVar29 = 0;
            do {
              auVar43 = vpbroadcastq_avx512f();
              auVar44 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar41);
              uVar11 = vpcmpuq_avx512f(auVar43,auVar42,2);
              bVar13 = (byte)uVar11;
              uVar11 = vpcmpuq_avx512f(auVar44,auVar42,2);
              bVar14 = (byte)uVar11;
              uVar36 = CONCAT11(bVar14,bVar13);
              auVar44 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*pauVar27 + uVar29 * 4));
              auVar43._4_4_ = (uint)((byte)(uVar36 >> 1) & 1) * auVar44._4_4_;
              auVar43._0_4_ = (uint)(bVar13 & 1) * auVar44._0_4_;
              auVar43._8_4_ = (uint)((byte)(uVar36 >> 2) & 1) * auVar44._8_4_;
              auVar43._12_4_ = (uint)((byte)(uVar36 >> 3) & 1) * auVar44._12_4_;
              auVar43._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * auVar44._16_4_;
              auVar43._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * auVar44._20_4_;
              auVar43._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * auVar44._24_4_;
              auVar43._28_4_ = (uint)((byte)(uVar36 >> 7) & 1) * auVar44._28_4_;
              auVar43._32_4_ = (uint)(bVar14 & 1) * auVar44._32_4_;
              auVar43._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar44._36_4_;
              auVar43._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar44._40_4_;
              auVar43._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar44._44_4_;
              auVar43._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar44._48_4_;
              auVar43._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar44._52_4_;
              auVar43._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar44._56_4_;
              auVar43._60_4_ = (uint)(bVar14 >> 7) * auVar44._60_4_;
              auVar43 = vpsrld_avx512f(auVar43,0x10);
              pauVar1 = (undefined1 (*) [32])((long)*pauVar30 + uVar29 * 2);
              auVar37 = vpmovdw_avx512f(auVar43);
              auVar38._0_2_ =
                   (ushort)(bVar13 & 1) * auVar37._0_2_ |
                   (ushort)!(bool)(bVar13 & 1) * *(short *)*pauVar1;
              bVar8 = (bool)((byte)(uVar36 >> 1) & 1);
              auVar38._2_2_ =
                   (ushort)bVar8 * auVar37._2_2_ | (ushort)!bVar8 * *(short *)((long)*pauVar1 + 2);
              bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
              auVar38._4_2_ =
                   (ushort)bVar8 * auVar37._4_2_ | (ushort)!bVar8 * *(short *)((long)*pauVar1 + 4);
              bVar8 = (bool)((byte)(uVar36 >> 3) & 1);
              auVar38._6_2_ =
                   (ushort)bVar8 * auVar37._6_2_ | (ushort)!bVar8 * *(short *)((long)*pauVar1 + 6);
              bVar8 = (bool)((byte)(uVar36 >> 4) & 1);
              auVar38._8_2_ =
                   (ushort)bVar8 * auVar37._8_2_ | (ushort)!bVar8 * *(short *)((long)*pauVar1 + 8);
              bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
              auVar38._10_2_ =
                   (ushort)bVar8 * auVar37._10_2_ | (ushort)!bVar8 * *(short *)((long)*pauVar1 + 10)
              ;
              bVar8 = (bool)((byte)(uVar36 >> 6) & 1);
              auVar38._12_2_ =
                   (ushort)bVar8 * auVar37._12_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0xc);
              bVar8 = (bool)((byte)(uVar36 >> 7) & 1);
              auVar38._14_2_ =
                   (ushort)bVar8 * auVar37._14_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0xe);
              auVar38._16_2_ =
                   (ushort)(bVar14 & 1) * auVar37._16_2_ |
                   (ushort)!(bool)(bVar14 & 1) * *(short *)((long)*pauVar1 + 0x10);
              bVar8 = (bool)(bVar14 >> 1 & 1);
              auVar38._18_2_ =
                   (ushort)bVar8 * auVar37._18_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0x12);
              bVar8 = (bool)(bVar14 >> 2 & 1);
              auVar38._20_2_ =
                   (ushort)bVar8 * auVar37._20_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0x14);
              bVar8 = (bool)(bVar14 >> 3 & 1);
              auVar38._22_2_ =
                   (ushort)bVar8 * auVar37._22_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0x16);
              bVar8 = (bool)(bVar14 >> 4 & 1);
              auVar38._24_2_ =
                   (ushort)bVar8 * auVar37._24_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0x18);
              bVar8 = (bool)(bVar14 >> 5 & 1);
              auVar38._26_2_ =
                   (ushort)bVar8 * auVar37._26_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0x1a);
              bVar8 = (bool)(bVar14 >> 6 & 1);
              auVar38._28_2_ =
                   (ushort)bVar8 * auVar37._28_2_ |
                   (ushort)!bVar8 * *(short *)((long)*pauVar1 + 0x1c);
              auVar38._30_2_ =
                   (ushort)(bVar14 >> 7) * auVar37._30_2_ |
                   (ushort)!(bool)(bVar14 >> 7) * *(short *)((long)*pauVar1 + 0x1e);
              *pauVar1 = auVar38;
              uVar29 = uVar29 + 0x10;
            } while (((ulong)(~uVar24 + uVar20) + 0x10 & 0x1fffffff0) != uVar29);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar18);
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
LAB_004da9bc:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
    iVar18 = cpu_support_x86_avx512_bf16();
    if (iVar18 == 0) {
      iVar18 = bottom_blob->c;
      if (0 < (long)iVar18) {
        uVar20 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar28 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar31 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar20 < 8) {
            uVar24 = 0;
          }
          else {
            iVar32 = 7;
            do {
              auVar9 = vlddqu_avx(*pauVar28);
              auVar10 = vpunpcklwd_avx(ZEXT816(0) << 0x40,auVar9);
              auVar9 = vpunpckhwd_avx(ZEXT816(0) << 0x40,auVar9);
              pauVar31[1] = auVar9;
              *pauVar31 = auVar10;
              pauVar28 = pauVar28 + 1;
              pauVar31 = pauVar31 + 2;
              iVar32 = iVar32 + 8;
              uVar24 = uVar20 & 0xfffffff8;
            } while (iVar32 < (int)uVar20);
          }
          if ((int)uVar24 < (int)uVar20) {
            auVar42 = vpbroadcastq_avx512f();
            uVar29 = 0;
            do {
              auVar43 = vpbroadcastq_avx512f();
              auVar44 = vporq_avx512f(auVar43,auVar40);
              auVar43 = vporq_avx512f(auVar43,auVar41);
              uVar11 = vpcmpuq_avx512f(auVar43,auVar42,2);
              uVar12 = vpcmpuq_avx512f(auVar44,auVar42,2);
              bVar13 = (byte)uVar12;
              uVar36 = CONCAT11(bVar13,(byte)uVar11);
              auVar39 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(*pauVar28 + uVar29 * 2));
              auVar37._2_2_ = (ushort)((byte)(uVar36 >> 1) & 1) * auVar39._2_2_;
              auVar37._0_2_ = (ushort)((byte)uVar11 & 1) * auVar39._0_2_;
              auVar37._4_2_ = (ushort)((byte)(uVar36 >> 2) & 1) * auVar39._4_2_;
              auVar37._6_2_ = (ushort)((byte)(uVar36 >> 3) & 1) * auVar39._6_2_;
              auVar37._8_2_ = (ushort)((byte)(uVar36 >> 4) & 1) * auVar39._8_2_;
              auVar37._10_2_ = (ushort)((byte)(uVar36 >> 5) & 1) * auVar39._10_2_;
              auVar37._12_2_ = (ushort)((byte)(uVar36 >> 6) & 1) * auVar39._12_2_;
              auVar37._14_2_ = (ushort)((byte)(uVar36 >> 7) & 1) * auVar39._14_2_;
              auVar37._16_2_ = (ushort)(bVar13 & 1) * auVar39._16_2_;
              auVar37._18_2_ = (ushort)(bVar13 >> 1 & 1) * auVar39._18_2_;
              auVar37._20_2_ = (ushort)(bVar13 >> 2 & 1) * auVar39._20_2_;
              auVar37._22_2_ = (ushort)(bVar13 >> 3 & 1) * auVar39._22_2_;
              auVar37._24_2_ = (ushort)(bVar13 >> 4 & 1) * auVar39._24_2_;
              auVar37._26_2_ = (ushort)(bVar13 >> 5 & 1) * auVar39._26_2_;
              auVar37._28_2_ = (ushort)(bVar13 >> 6 & 1) * auVar39._28_2_;
              auVar37._30_2_ = (ushort)(bVar13 >> 7) * auVar39._30_2_;
              auVar43 = vpmovzxwd_avx512f(auVar37);
              auVar43 = vpslld_avx512f(auVar43,0x10);
              auVar43 = vmovdqu32_avx512f(auVar43);
              *(undefined1 (*) [64])(*pauVar31 + uVar29 * 4) = auVar43;
              uVar29 = uVar29 + 0x10;
            } while (((ulong)(~uVar24 + uVar20) + 0x10 & 0x1fffffff0) != uVar29);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar18);
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}